

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_compress(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uLong uncomprLen_local;
  uLong comprLen_local;
  
  uncomprLen_local = uncomprLen;
  comprLen_local = comprLen;
  sVar3 = strlen(hello);
  uVar1 = compress(compr,&comprLen_local,hello,sVar3 + 1);
  if (uVar1 == 0) {
    builtin_memcpy(uncompr,"garbage",8);
    uVar1 = uncompress(uncompr,&uncomprLen_local,compr,comprLen_local);
    if (uVar1 == 0) {
      iVar2 = strcmp((char *)uncompr,hello);
      if (iVar2 == 0) {
        printf("uncompress(): %s\n",uncompr);
        return;
      }
      fwrite("bad uncompress\n",0xf,1,_stderr);
      goto LAB_0010244e;
    }
    pcVar4 = "uncompress";
  }
  else {
    pcVar4 = "compress";
  }
  fprintf(_stderr,"%s error: %d\n",pcVar4,(ulong)uVar1);
LAB_0010244e:
  exit(1);
}

Assistant:

void test_compress(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    uLong len = (uLong)strlen(hello)+1;

    err = compress(compr, &comprLen, (const Bytef*)hello, len);
    CHECK_ERR(err, "compress");

    strcpy((char*)uncompr, "garbage");

    err = uncompress(uncompr, &uncomprLen, compr, comprLen);
    CHECK_ERR(err, "uncompress");

    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad uncompress\n");
        exit(1);
    } else {
        printf("uncompress(): %s\n", (char *)uncompr);
    }
}